

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O1

Num * __thiscall Num::operator-(Num *__return_storage_ptr__,Num *this,Num *n2)

{
  uint in_EAX;
  ushort length;
  ulong uVar1;
  Byte BVar2;
  Num *this_00;
  Byte carry;
  undefined8 uStack_38;
  
  length = (ushort)*(undefined4 *)n2;
  if ((ushort)*(undefined4 *)n2 < (ushort)*(undefined4 *)this) {
    length = (ushort)*(undefined4 *)this;
  }
  this_00 = __return_storage_ptr__;
  uStack_38._0_4_ = in_EAX;
  Num(__return_storage_ptr__,length,0);
  uStack_38 = (ulong)(uint)uStack_38;
  if (length != 0) {
    uVar1 = 0;
    do {
      this_00 = (Num *)0x0;
      if (uVar1 < (ushort)(this->base)._M_string_length) {
        this_00 = (Num *)(ulong)((int)(this->base)._M_dataplus._M_p[uVar1] - 0x30);
      }
      BVar2 = 0;
      if (uVar1 < (ushort)(n2->base)._M_string_length) {
        BVar2 = (int)(n2->base)._M_dataplus._M_p[uVar1] - 0x30;
      }
      BVar2 = Multiplicator::baseSubstraction((Byte)this_00,BVar2,(Byte *)((long)&uStack_38 + 4));
      __return_storage_ptr__->size = (Short)uVar1;
      (__return_storage_ptr__->base)._M_dataplus._M_p[uVar1] = (char)BVar2 + '0';
      uVar1 = uVar1 + 1;
    } while (length != uVar1);
  }
  delereZeros(this_00,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Num  Num::operator-(const Num& n2)
{
    Short m = std::max(size, n2.size);
    Num result(m, 0);
    Byte carry = 0;
    for (Short i = 0; i < m; ++i)
    {
        Byte dig = Multiplicator::baseSubstraction(getDigit(i), n2.getDigit(i), carry);
        result.setDigit(i, dig);
    }
    delereZeros(result);
    return result;
}